

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void polyscope::view::flyToHomeView(void)

{
  float Tfov;
  mat4x4 T;
  float in_stack_000000a8;
  float in_stack_000000ac;
  mat4 *in_stack_000000b0;
  
  computeHomeView();
  nearClipRatio = 0x3f747ae147ae147b;
  farClipRatio = 0x4034000000000000;
  startFlightTo(in_stack_000000b0,in_stack_000000ac,in_stack_000000a8);
  return;
}

Assistant:

void flyToHomeView() {

  // WARNING: Duplicated here and in resetCameraToHomeView()

  glm::mat4x4 T = computeHomeView();

  float Tfov = defaultFov;
  nearClipRatio = defaultNearClipRatio;
  farClipRatio = defaultFarClipRatio;

  startFlightTo(T, Tfov);
}